

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O2

result_type __thiscall
boost::random::
well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<-21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<-13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<-10>,_boost::random::detail::M2<-5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
::operator()(well_engine<unsigned_int,_32UL,_17UL,_23UL,_11UL,_10UL,_7UL,_boost::random::detail::M3<_21>,_boost::random::detail::M3<6>,_boost::random::detail::M0,_boost::random::detail::M3<_13>,_boost::random::detail::M3<13>,_boost::random::detail::M2<_10>,_boost::random::detail::M2<_5>,_boost::random::detail::M3<13>,_boost::random::detail::no_tempering>
             *this)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  
  uVar1 = detail::generic_modulo<unsigned_long,_17UL>::compute(this->index_);
  uVar2 = detail::generic_modulo<unsigned_long,_17UL>::compute(uVar1 + 0x10);
  uVar3 = detail::generic_modulo<unsigned_long,_17UL>::compute(uVar1 + 0xf);
  uVar4 = detail::generic_modulo<unsigned_long,_17UL>::compute(uVar1 + 0xb);
  detail::generic_modulo<unsigned_long,_17UL>::compute(uVar1 + 10);
  uVar5 = detail::generic_modulo<unsigned_long,_17UL>::compute(uVar1 + 7);
  uVar6 = this->state_[uVar3] & 0x7fffff | this->state_[uVar2] & 0xff800000;
  uVar7 = this->state_[uVar4] >> 6 ^
          this->state_[uVar1] << 0x15 ^ this->state_[uVar1] ^ this->state_[uVar4];
  uVar8 = this->state_[uVar5] << 0xd ^ this->state_[uVar5];
  uVar9 = uVar7 ^ uVar8;
  uVar6 = uVar9 >> 0xd ^ uVar6 ^ uVar8 << 5 ^ uVar6 >> 0xd ^ uVar7 << 10 ^ uVar9;
  this->state_[uVar1] = uVar9;
  this->state_[uVar2] = uVar6;
  this->index_ = uVar2;
  return uVar6;
}

Assistant:

result_type operator()()
    {
        BOOST_CONSTEXPR_OR_CONST UIntType upper_mask = ~0U << p;
        BOOST_CONSTEXPR_OR_CONST UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        const std::size_t i = mod(index_);

        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        const std::size_t j = i + r;
        const std::size_t k = mod(j - 1); // [i,r-1]
        const std::size_t l = mod(j - 2); // [i,r-2]

        const std::size_t im1 = mod(i + m1);
        const std::size_t im2 = mod(i + m2);
        const std::size_t im3 = mod(i + m3);

        UIntType z0;
        UIntType z1;
        UIntType z2;
        UIntType z3;
        UIntType z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state_[im1]);
        z2 = T2::transform(state_[im2]) ^
             T3::transform(state_[im3]);
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<UIntType, r>(z4, state_, im2);
    }